

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O3

void __thiscall
dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::Node
          (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *this,Value **k)

{
  _Rb_tree_header *p_Var1;
  
  this->key = *k;
  this->dg = (LLVMDependenceGraph *)0x0;
  p_Var1 = &(this->controlDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
            super__Rb_tree_header;
  (this->controlDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->controlDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->controlDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->controlDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->controlDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->dataDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
            super__Rb_tree_header;
  (this->dataDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->dataDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->dataDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->dataDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->dataDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->useEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
            super__Rb_tree_header;
  (this->useEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->useEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->useEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->useEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->useEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->interferenceDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
            _M_impl.super__Rb_tree_header;
  (this->interferenceDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->interferenceDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl
           .super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->interferenceDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl
           .super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->interferenceDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl
           .super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->interferenceDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->revControlDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
            super__Rb_tree_header;
  (this->revControlDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->revControlDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->revControlDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->revControlDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->revControlDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->revDataDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
            super__Rb_tree_header;
  (this->revDataDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->revDataDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->revDataDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->revDataDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->revDataDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->userEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
            super__Rb_tree_header;
  (this->userEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->userEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->userEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->userEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->userEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->revInterferenceDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
            _M_impl.super__Rb_tree_header;
  (this->revInterferenceDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->revInterferenceDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->revInterferenceDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->revInterferenceDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->revInterferenceDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->subgraphs)._M_t._M_impl.super__Rb_tree_header;
  (this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->slice_id = 0;
  (this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->parameters = (DGParameters<dg::LLVMNode> *)0x0;
  (this->analysisAuxData).bfsorder = 0;
  this->basicBlock = (BBlock<dg::LLVMNode> *)0x0;
  (this->analysisAuxData).lastwalkid = 0;
  (this->analysisAuxData).dfsorder = 0;
  return;
}

Assistant:

Node(const KeyT &k) : key(k) {}